

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

string * __thiscall Dashel::ParameterSet::get_abi_cxx11_(ParameterSet *this,char *key)

{
  const_iterator cVar1;
  string *psVar2;
  DashelException *this_00;
  allocator<char> local_59;
  string r;
  allocator<char> local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&r,key,local_38);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&r);
  std::__cxx11::string::~string((string *)&r);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->values)._M_t._M_impl.super__Rb_tree_header) {
    return (string *)(cVar1._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"Parameter missing: ",&local_59);
  psVar2 = (string *)std::__cxx11::string::append((char *)local_38);
  std::__cxx11::string::string((string *)&r,psVar2);
  std::__cxx11::string::~string((string *)local_38);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(this_00,InvalidTarget,0,r._M_dataplus._M_p,(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::string& ParameterSet::get(const char* key) const
	{
		std::map<std::string, std::string>::const_iterator it = values.find(key);
		if (it == values.end())
		{
			std::string r = std::string("Parameter missing: ").append(key);
			throw DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}
		return it->second;
	}